

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void CreateNewEntry<Assimp::LWO::WeightChannel>
               (vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                *list,uint srcIdx)

{
  pointer pWVar1;
  WeightChannel *elem;
  pointer chan;
  
  pWVar1 = (list->
           super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (chan = (list->
              super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
              )._M_impl.super__Vector_impl_data._M_start; chan != pWVar1; chan = chan + 1) {
    CreateNewEntry<Assimp::LWO::WeightChannel>(chan,srcIdx);
  }
  return;
}

Assistant:

inline void CreateNewEntry(std::vector< T >& list, unsigned int srcIdx)
{
    for (auto &elem : list)   {
        CreateNewEntry( elem, srcIdx );
    }
}